

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::LoadLWO2TextureBlock(LWOImporter *this,SubChunkHeader *head,uint size)

{
  uint32_t uVar1;
  pointer pSVar2;
  _Alloc_hider __s1;
  int iVar3;
  Logger *pLVar4;
  long lVar5;
  _Node *p_Var6;
  list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *this_00;
  char *message;
  list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *plVar7;
  Texture tex;
  Texture local_c0;
  
  pSVar2 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->mSurfaces->
      super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
      super__Vector_impl_data._M_start == pSVar2) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x270,
                  "void Assimp::LWOImporter::LoadLWO2TextureBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  LWO::Texture::Texture(&local_c0);
  LoadLWO2TextureHeader(this,(uint)head->length,&local_c0);
  uVar1 = head->type;
  if (uVar1 == 0x47524144) {
    pLVar4 = DefaultLogger::get();
    message = "LWO2: Found gradient texture, this is not supported";
LAB_003f5bb9:
    Logger::error(pLVar4,message);
    local_c0.bCanUse = false;
  }
  else if (uVar1 == 0x494d4150) {
    LoadLWO2ImageMap(this,(size - head->length) - 6,&local_c0);
  }
  else if (uVar1 == 0x50524f43) {
    pLVar4 = DefaultLogger::get();
    message = "LWO2: Found procedural texture, this is not supported";
    goto LAB_003f5bb9;
  }
  __s1._M_p = local_c0.ordinal._M_dataplus._M_p;
  if ((int)local_c0.type < 0x474c4f53) {
    if (local_c0.type == 0x42554d50) {
      lVar5 = -0x58;
    }
    else if (local_c0.type == 0x434f4c52) {
      lVar5 = -0xb8;
    }
    else {
      if (local_c0.type != 0x44494646) goto LAB_003f5c2d;
      lVar5 = -0xa0;
    }
  }
  else if ((int)local_c0.type < 0x53504543) {
    if (local_c0.type == 0x474c4f53) {
      lVar5 = -0x40;
    }
    else {
      if (local_c0.type != 0x5245464c) {
LAB_003f5c2d:
        pLVar4 = DefaultLogger::get();
        Logger::warn(pLVar4,"LWO2: Encountered unknown texture type");
        goto LAB_003f5cb6;
      }
      lVar5 = -0x28;
    }
  }
  else if (local_c0.type == 0x53504543) {
    lVar5 = -0x88;
  }
  else {
    if (local_c0.type != 0x5452414e) goto LAB_003f5c2d;
    lVar5 = -0x70;
  }
  this_00 = (list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> *)
            ((long)&(pSVar2->mName)._M_dataplus._M_p + lVar5);
  plVar7 = this_00;
  do {
    plVar7 = *(list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>> **)plVar7;
    if (plVar7 == this_00) {
      p_Var6 = std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
               _M_create_node<Assimp::LWO::Texture_const&>(this_00,&local_c0);
      goto LAB_003f5cad;
    }
    iVar3 = strcmp(__s1._M_p,*(char **)(plVar7 + 0x88));
  } while (-1 < iVar3);
  p_Var6 = std::__cxx11::list<Assimp::LWO::Texture,std::allocator<Assimp::LWO::Texture>>::
           _M_create_node<Assimp::LWO::Texture_const&>(this_00,&local_c0);
LAB_003f5cad:
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 1;
LAB_003f5cb6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.ordinal._M_dataplus._M_p != &local_c0.ordinal.field_2) {
    operator_delete(local_c0.ordinal._M_dataplus._M_p,
                    local_c0.ordinal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mUVChannelIndex._M_dataplus._M_p != &local_c0.mUVChannelIndex.field_2) {
    operator_delete(local_c0.mUVChannelIndex._M_dataplus._M_p,
                    local_c0.mUVChannelIndex.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mFileName._M_dataplus._M_p != &local_c0.mFileName.field_2) {
    operator_delete(local_c0.mFileName._M_dataplus._M_p,
                    local_c0.mFileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2TextureBlock(LE_NCONST IFF::SubChunkHeader* head, unsigned int size )
{
    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture tex;

    // load the texture header
    LoadLWO2TextureHeader(head->length,tex);
    size -= head->length + 6;

    // now get the exact type of the texture
    switch (head->type)
    {
    case AI_LWO_PROC:
        LoadLWO2Procedural(size,tex);
        break;
    case AI_LWO_GRAD:
        LoadLWO2Gradient(size,tex);
        break;
    case AI_LWO_IMAP:
        LoadLWO2ImageMap(size,tex);
    }

    // get the destination channel
    TextureList* listRef = NULL;
    switch (tex.type)
    {
    case AI_LWO_COLR:
        listRef = &surf.mColorTextures;break;
    case AI_LWO_DIFF:
        listRef = &surf.mDiffuseTextures;break;
    case AI_LWO_SPEC:
        listRef = &surf.mSpecularTextures;break;
    case AI_LWO_GLOS:
        listRef = &surf.mGlossinessTextures;break;
    case AI_LWO_BUMP:
        listRef = &surf.mBumpTextures;break;
    case AI_LWO_TRAN:
        listRef = &surf.mOpacityTextures;break;
    case AI_LWO_REFL:
        listRef = &surf.mReflectionTextures;break;
    default:
        ASSIMP_LOG_WARN("LWO2: Encountered unknown texture type");
        return;
    }

    // now attach the texture to the parent surface - sort by ordinal string
    for (TextureList::iterator it = listRef->begin();it != listRef->end(); ++it)    {
        if (::strcmp(tex.ordinal.c_str(),(*it).ordinal.c_str()) < 0)    {
            listRef->insert(it,tex);
            return;
        }
    }
    listRef->push_back(tex);
}